

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O0

void __thiscall Start::StartGameNowTigersBattle5(Start *this,double *credits,uint *bet)

{
  pointer *this_00;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_1e0 [8];
  SelectGame selectgame_1;
  CreditField addCreditBeforeExit;
  Start startGame;
  undefined1 local_178 [8];
  Matrix myMatrix;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  Bet currentBet;
  uint bet_1;
  CreditField myCredit;
  undefined1 local_120 [7];
  PrintGameName printWelcome;
  SelectGame selectgame;
  CreditField addCredit;
  Gamble gambleInfoScreen;
  Bet settingBet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  undefined1 local_b0 [8];
  PaytableTigersBattle paytableForGame;
  string local_80 [4];
  uint minBet;
  string p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_50;
  undefined1 local_38 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  uint *bet_local;
  double *credits_local;
  Start *this_local;
  
  myVectorInStart.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bet;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38);
  Matrix::getVectorMatrix(&local_50,&this->super_Matrix);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_38,&local_50);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_50);
  std::__cxx11::string::string(local_80);
  paytableForGame._36_4_ = 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c8,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38);
  PaytableTigersBattle::PaytableTigersBattle
            ((PaytableTigersBattle *)local_b0,&local_c8,*credits,
             *(uint *)&((myVectorInStart.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  while (1.0 <= *credits) {
    if ((*credits <
         (double)*(uint *)&((myVectorInStart.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) && (1.0 <= *credits)) {
      *(undefined4 *)
       &((myVectorInStart.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
        super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
           paytableForGame._36_4_;
      poVar2 = std::operator<<((ostream *)&std::cout,"Changing Bet to min: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(uint *)&((myVectorInStart.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_start);
      poVar2 = std::operator<<(poVar2," Euro!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'p\' to Start a Game!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'e\' to Change the Bet!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'i\' to see the Paytable!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'c\' to Cashout!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'a\' to add credit!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'q\' for More Games!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'l\' for Changing lines!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
    poVar2 = std::operator<<(poVar2," Euro!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_80);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'p') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      takeCreditsWithBet(this,credits,
                         (uint *)myVectorInStart.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Matrix::RandomNumbersInMatrix
                ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&settingBet._credit_bet,&this->super_Matrix,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_38);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&settingBet._credit_bet);
      poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Matrix::outPutMatrix
                (&this->super_Matrix,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_38);
      poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      checkForCreditsAndBet
                (this,credits,
                 (uint *)myVectorInStart.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      outputCreditsAndBetCurrent
                (this,credits,
                 (uint *)myVectorInStart.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PaytableTigersBattle::PaytableTigersBattleWin5
                ((PaytableTigersBattle *)local_b0,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_38,credits,
                 (uint *)myVectorInStart.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'e') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&gambleInfoScreen,
               *(uint *)&((myVectorInStart.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,*credits);
      Bet::selectBetTigersBattle5
                ((Bet *)&gambleInfoScreen,
                 (uint *)myVectorInStart.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,credits);
      Bet::~Bet((Bet *)&gambleInfoScreen);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'i') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PaytableTigersBattle::PaytableTigersBattleWinInfo5((PaytableTigersBattle *)local_b0);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'c') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      if (*credits <= 0.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
        poVar2 = std::operator<<(poVar2," Euro!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        *credits = 0.0;
      }
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'g') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      Gamble::Gamble((Gamble *)&addCredit);
      Gamble::GambleInfoScreen((Gamble *)&addCredit);
      Gamble::~Gamble((Gamble *)&addCredit);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'a') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      CreditField::CreditField((CreditField *)&selectgame._credits);
      CreditField::AddCredit((CreditField *)&selectgame._credits,credits);
      CreditField::~CreditField((CreditField *)&selectgame._credits);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'q') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      SelectGame::SelectGame((SelectGame *)local_120);
      SelectGame::selectGame_Welcome((SelectGame *)local_120);
      SelectGame::selectGame_Games((SelectGame *)local_120);
      SelectGame::selectGame_Option((SelectGame *)local_120,credits);
      SelectGame::~SelectGame((SelectGame *)local_120);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if ((*pcVar3 == 'l') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit._credit + 7));
      PrintGameName::PrintGameNameWelcomeTigersBattle10
                ((PrintGameName *)((long)&myCredit._credit + 7));
      if (*credits <= 2.0 && *credits != 2.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xfffffffffffffed0);
        CreditField::AddCredit((CreditField *)&stack0xfffffffffffffed0,credits);
        CreditField::~CreditField((CreditField *)&stack0xfffffffffffffed0);
      }
      currentBet._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&myMatrixVector.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,*credits);
      Bet::selectBetTigersBattle10
                ((Bet *)&myMatrixVector.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (uint *)((long)&currentBet._credit_bet + 4),credits);
      this_00 = &myMatrix._matrixVec.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this_00);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&startGame._bet,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this_00);
      Matrix::Matrix((Matrix *)local_178,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&startGame._bet);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&startGame._bet);
      Start((Start *)&addCreditBeforeExit,*credits,currentBet._credit_bet._4_4_);
      StartGameNowTigersBattle10
                ((Start *)&addCreditBeforeExit,credits,(uint *)((long)&currentBet._credit_bet + 4));
      ~Start((Start *)&addCreditBeforeExit);
      Matrix::~Matrix((Matrix *)local_178);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&myMatrix._matrixVec.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Bet::~Bet((Bet *)&myMatrixVector.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit._credit + 7));
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      CreditField::CreditField((CreditField *)&selectgame_1._credits);
      CreditField::AddCredit((CreditField *)&selectgame_1._credits,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You need to add atleast 1 Euro!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
        poVar2 = std::operator<<(poVar2," Euro.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        *credits = 0.0;
        SelectGame::SelectGame((SelectGame *)local_1e0);
        SelectGame::selectGame_Welcome((SelectGame *)local_1e0);
        SelectGame::selectGame_Games((SelectGame *)local_1e0);
        SelectGame::selectGame_Option((SelectGame *)local_1e0,credits);
        SelectGame::~SelectGame((SelectGame *)local_1e0);
      }
      CreditField::~CreditField((CreditField *)&selectgame_1._credits);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_38);
  }
  PaytableTigersBattle::~PaytableTigersBattle((PaytableTigersBattle *)local_b0);
  std::__cxx11::string::~string(local_80);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Start::StartGameNowTigersBattle5(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	myVectorInStart = getVectorMatrix();
	std::string p;

	unsigned int minBet = 1;
	PaytableTigersBattle paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		std::cout << "Press 'l' for Changing lines!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");

			takeCreditsWithBet(credits, bet);
			RandomNumbersInMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			paytableForGame.PaytableTigersBattleWin5(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetTigersBattle5(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			paytableForGame.PaytableTigersBattleWinInfo5();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		if (p[0] == 'l' && p.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle10(); // changed
			//credit
			if (credits < 2) {
				std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle10(bet, credits); //Changing to 5 Lines bet 1 to 5 

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle10(credits, bet);
		}
		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}